

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool __thiscall cppcms::xss::uri_parser::hier_part(uri_parser *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  
  pcVar3 = this->begin_;
  bVar1 = follows(this,"//");
  if (bVar1) {
    bVar1 = authority(this);
    if (bVar1) {
      bVar1 = path_abempty(this);
      if (bVar1) {
        pcVar3 = this->begin_;
      }
    }
    else {
      bVar1 = false;
    }
    this->begin_ = pcVar3;
  }
  else {
    this->begin_ = pcVar3;
    bVar2 = path_absolute(this);
    bVar1 = true;
    if (!bVar2) {
      path_rootless(this);
    }
  }
  return bVar1;
}

Assistant:

bool hier_part()
		{
			{
				save_point sp(this);
				if(follows("//")) {
					if(!authority() || !path_abempty()) 
						return false;
					sp.commit();
					return true;
				}
			}

			return path_absolute() || path_rootless() || true;
		}